

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O0

SubTypeAccess * __thiscall
glu::SubTypeAccess::element(SubTypeAccess *__return_storage_ptr__,SubTypeAccess *this,int ndx)

{
  SubTypeAccess *pSVar1;
  SubTypeAccess local_50;
  int local_1c;
  SubTypeAccess *pSStack_18;
  int ndx_local;
  SubTypeAccess *this_local;
  
  local_1c = ndx;
  pSStack_18 = this;
  this_local = __return_storage_ptr__;
  SubTypeAccess(&local_50,this);
  pSVar1 = element(&local_50,local_1c);
  SubTypeAccess(__return_storage_ptr__,pSVar1);
  ~SubTypeAccess(&local_50);
  return __return_storage_ptr__;
}

Assistant:

SubTypeAccess				element				(int ndx) const { return SubTypeAccess(*this).element(ndx);		}